

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall ot::commissioner::Interpreter::PrintOrExport(Interpreter *this,Value *aValue)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer aPath;
  string_view fmt;
  format_args args;
  Error error;
  string out;
  string filePath;
  string output;
  undefined1 local_118 [8];
  _Alloc_hider _Stack_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  code *local_f0;
  type local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78 [2];
  
  Value::ToString_abi_cxx11_(local_78,aValue);
  if ((aValue->mError).mCode == kNone) {
    aPath = (this->mContext).mExportFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 != aPath) {
      local_e0 = none_type;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      while( true ) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar2 = (aPath->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + aPath->_M_string_length);
        RestoreFilePath((Error *)local_118,aPath);
        local_e0 = local_118._0_4_;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&_Stack_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_110._M_p != &local_100) {
          operator_delete(_Stack_110._M_p);
        }
        if (local_e0 != none_type) {
          Console::Write(&local_d8,kRed);
          goto LAB_00132b88;
        }
        Value::ToString_abi_cxx11_(&local_b8,aValue);
        WriteFile((Error *)local_118,&local_b8,&local_98);
        local_e0 = local_118._0_4_;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&_Stack_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_110._M_p != &local_100) {
          operator_delete(_Stack_110._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (local_e0 != none_type) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        aPath = aPath + 1;
        if (aPath == pbVar1) goto LAB_00132ba2;
      }
      local_118._0_4_ = string_type;
      _Stack_110._M_p = "failed to write to \'{}\'\n";
      local_108 = 0x18;
      local_100._M_allocated_capacity = 0x100000000;
      local_f0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      begin = "failed to write to \'{}\'\n";
      local_100._8_8_ = local_118;
      do {
        pcVar3 = begin + 1;
        if (*begin == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char> *)local_118);
        }
        begin = pcVar3;
      } while (pcVar3 != "");
      local_118 = (undefined1  [8])local_98._M_dataplus._M_p;
      _Stack_110._M_p = (pointer)local_98._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x18;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_118;
      ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)"failed to write to \'{}\'\n",fmt,args);
      Console::Write(&local_b8,kRed);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
LAB_00132b88:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
LAB_00132ba2:
      if (local_e0 == none_type) {
        local_78[0]._M_string_length = 0;
        *local_78[0]._M_dataplus._M_p = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
  }
  if (local_78[0]._M_string_length != 0) {
    std::__cxx11::string::append((char *)local_78);
  }
  std::__cxx11::string::append((char *)local_78);
  Console::Write(local_78,((aValue->mError).mCode == kNone) + kRed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
    operator_delete(local_78[0]._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Interpreter::PrintOrExport(const Value &aValue)
{
    std::string output = aValue.ToString();

    if (aValue.HasNoError() && mContext.mExportFiles.size() > 0)
    {
        Error error;

        for (const auto &path : mContext.mExportFiles)
        {
            std::string filePath = path;

            // Make sure folder path exists, if it's not creatable, print error and output to console instead
            error = RestoreFilePath(path);
            if (error != ERROR_NONE)
            {
                Console::Write(error.GetMessage(), Console::Color::kRed);
                break;
            }
            ///
            /// @todo: maybe instead of overwriting an existing file
            ///        suggest a new file name by incrementing suffix
            ///        filePath[-suffix].ext
            ///
            error = WriteFile(aValue.ToString(), filePath);
            if (error != ERROR_NONE)
            {
                std::string out = fmt::format(FMT_STRING("failed to write to '{}'\n"), filePath);
                Console::Write(out, Console::Color::kRed);
                break;
            }
        }
        if (error == ERROR_NONE)
        {
            // value is written to file, no console output expected other than
            // [done]/[failed]
            output.clear();
        }
    }
    if (!output.empty())
    {
        output += "\n";
    }
    output += aValue.HasNoError() ? "[done]" : "[failed]";
    auto color = aValue.HasNoError() ? Console::Color::kGreen : Console::Color::kRed;

    Console::Write(output, color);
}